

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O2

Value * duckdb::PragmaFunctionExtractor::GetVarArgs
                  (Value *__return_storage_ptr__,PragmaFunctionCatalogEntry *entry,idx_t offset)

{
  bool bVar1;
  LogicalType local_160;
  string local_148;
  PragmaFunction fun;
  
  FunctionSet<duckdb::PragmaFunction>::GetFunctionByOffset
            (&fun,&(entry->functions).super_FunctionSet<duckdb::PragmaFunction>,offset);
  bVar1 = SimpleFunction::HasVarArgs((SimpleFunction *)&fun);
  if (bVar1) {
    LogicalType::ToString_abi_cxx11_
              (&local_148,&fun.super_SimpleNamedParameterFunction.super_SimpleFunction.varargs);
    Value::Value(__return_storage_ptr__,&local_148);
    ::std::__cxx11::string::~string((string *)&local_148);
  }
  else {
    LogicalType::LogicalType(&local_160,SQLNULL);
    Value::Value(__return_storage_ptr__,&local_160);
    LogicalType::~LogicalType(&local_160);
  }
  PragmaFunction::~PragmaFunction(&fun);
  return __return_storage_ptr__;
}

Assistant:

static Value GetVarArgs(PragmaFunctionCatalogEntry &entry, idx_t offset) {
		auto fun = entry.functions.GetFunctionByOffset(offset);
		return !fun.HasVarArgs() ? Value() : Value(fun.varargs.ToString());
	}